

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O3

void wallet::CachedTxGetAmounts
               (CWallet *wallet,CWalletTx *wtx,
               list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *listReceived,
               list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *listSent,
               CAmount *nFee,isminefilter *filter,bool include_change)

{
  size_t *psVar1;
  CTxOut *txout;
  uint uVar2;
  element_type *peVar3;
  bool bVar4;
  isminetype iVar5;
  uint uVar6;
  CAmount CVar7;
  CAmount CVar8;
  pointer pCVar9;
  _Node *p_Var10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  CScript *scriptPubKey;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  COutputEntry output;
  CTxDestination address;
  unique_lock<std::recursive_mutex> local_f8;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_e8;
  CAmount local_98;
  int local_90;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *nFee = 0;
  std::__cxx11::_List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::_M_clear
            (&listReceived->
              super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>);
  (listReceived->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)listReceived;
  (listReceived->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)listReceived;
  (listReceived->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>).
  _M_impl._M_node._M_size = 0;
  std::__cxx11::_List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::_M_clear
            (&listSent->
              super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>);
  (listSent->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)listSent;
  (listSent->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)listSent;
  (listSent->super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>)._M_impl.
  _M_node._M_size = 0;
  CVar7 = CachedTxGetDebit(wallet,wtx,filter);
  if (0 < CVar7) {
    CVar8 = CTransaction::GetValueOut
                      ((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    *nFee = CVar7 - CVar8;
  }
  local_f8._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_f8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_f8);
  peVar3 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar9 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar9) {
    uVar13 = 0;
    do {
      txout = pCVar9 + uVar13;
      iVar5 = CWallet::IsMine(wallet,txout);
      iVar12 = (int)uVar13;
      if (CVar7 < 1) {
        if ((*filter & iVar5) != ISMINE_NO) goto LAB_001e51d3;
      }
      else if ((include_change) || (bVar4 = ScriptIsChange(wallet,&txout->scriptPubKey), !bVar4)) {
LAB_001e51d3:
        local_88._16_8_ = 0;
        local_88._24_8_ = 0;
        local_88._0_8_ = 0;
        local_88._8_8_ = 0;
        local_40 = 0;
        scriptPubKey = &txout->scriptPubKey;
        bVar4 = ExtractDestination(scriptPubKey,(CTxDestination *)&local_88._M_first);
        if (!bVar4) {
          uVar2 = (txout->scriptPubKey).super_CScriptBase._size;
          uVar6 = uVar2 - 0x1d;
          if (uVar2 < 0x1d) {
            uVar6 = uVar2;
          }
          if (uVar6 != 0) {
            if (0x1c < uVar2) {
              scriptPubKey = (CScript *)
                             (scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
            }
            if ((10000 < uVar6) || ((scriptPubKey->super_CScriptBase)._union.direct[0] == 'j'))
            goto LAB_001e52a5;
          }
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&local_e8._M_first,
                     &((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->hash);
          CWallet::WalletLogPrintf<std::__cxx11::string>
                    (wallet,(ConstevalFormatString<1U>)0x49f475,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_e8._M_first);
          if ((uchar *)local_e8._0_8_ != local_e8._M_first._M_storage._M_storage + 0x10) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
          }
          local_e8._16_8_ = 0;
          local_e8._24_8_ = 0;
          local_e8._0_8_ = (undefined1 *)0x0;
          local_e8._8_8_ = 0;
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                       *)&local_88._M_first,(CNoDestination *)&local_e8._M_first);
          if (0x1c < (uint)local_e8._28_4_) {
            free((void *)local_e8._0_8_);
          }
        }
LAB_001e52a5:
        std::__detail::__variant::
        _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_e8._M_first,
                          (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_88._M_first);
        local_98 = txout->nValue;
        local_90 = iVar12;
        if (0 < CVar7) {
          p_Var10 = std::__cxx11::list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>>::
                    _M_create_node<wallet::COutputEntry_const&>
                              ((list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>> *)
                               listSent,(COutputEntry *)&local_e8._M_first);
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var10);
          psVar1 = &(listSent->
                    super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>).
                    _M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
        if ((*filter & iVar5) != ISMINE_NO) {
          p_Var10 = std::__cxx11::list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>>::
                    _M_create_node<wallet::COutputEntry_const&>
                              ((list<wallet::COutputEntry,std::allocator<wallet::COutputEntry>> *)
                               listReceived,(COutputEntry *)&local_e8._M_first);
          std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var10);
          psVar1 = &(listReceived->
                    super__List_base<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>).
                    _M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_e8._M_first);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_88._M_first);
      }
      uVar13 = (ulong)(iVar12 + 1);
      peVar3 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar9 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = ((long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar9 >> 3) * -0x3333333333333333;
    } while (uVar13 <= uVar11 && uVar11 - uVar13 != 0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CachedTxGetAmounts(const CWallet& wallet, const CWalletTx& wtx,
                  std::list<COutputEntry>& listReceived,
                  std::list<COutputEntry>& listSent, CAmount& nFee, const isminefilter& filter,
                  bool include_change)
{
    nFee = 0;
    listReceived.clear();
    listSent.clear();

    // Compute fee:
    CAmount nDebit = CachedTxGetDebit(wallet, wtx, filter);
    if (nDebit > 0) // debit>0 means we signed/sent this transaction
    {
        CAmount nValueOut = wtx.tx->GetValueOut();
        nFee = nDebit - nValueOut;
    }

    LOCK(wallet.cs_wallet);
    // Sent/received.
    for (unsigned int i = 0; i < wtx.tx->vout.size(); ++i)
    {
        const CTxOut& txout = wtx.tx->vout[i];
        isminetype fIsMine = wallet.IsMine(txout);
        // Only need to handle txouts if AT LEAST one of these is true:
        //   1) they debit from us (sent)
        //   2) the output is to us (received)
        if (nDebit > 0)
        {
            if (!include_change && OutputIsChange(wallet, txout))
                continue;
        }
        else if (!(fIsMine & filter))
            continue;

        // In either case, we need to get the destination address
        CTxDestination address;

        if (!ExtractDestination(txout.scriptPubKey, address) && !txout.scriptPubKey.IsUnspendable())
        {
            wallet.WalletLogPrintf("CWalletTx::GetAmounts: Unknown transaction type found, txid %s\n",
                                    wtx.GetHash().ToString());
            address = CNoDestination();
        }

        COutputEntry output = {address, txout.nValue, (int)i};

        // If we are debited by the transaction, add the output as a "sent" entry
        if (nDebit > 0)
            listSent.push_back(output);

        // If we are receiving the output, add it as a "received" entry
        if (fIsMine & filter)
            listReceived.push_back(output);
    }

}